

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O2

void __thiscall
pbrt::KdTreeAggregate::buildTree
          (KdTreeAggregate *this,int nodeNum,Bounds3f *nodeBounds,
          vector<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_> *allPrimBounds,
          int *primNums,int nPrimitives,int depth,
          unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_> *edges,int *prims0,
          int *prims1,int badRefines)

{
  Point3<float> *this_00;
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  int iVar6;
  KdAccelNode *__src;
  pointer pBVar7;
  float fVar8;
  float fVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  EdgeType *pEVar12;
  uint uVar13;
  int iVar14;
  KdAccelNode *pKVar15;
  long lVar16;
  Point3<float> *pPVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  pointer pBVar21;
  long lVar22;
  EdgeType *pEVar23;
  uint uVar24;
  int iVar25;
  BoundEdge *pBVar26;
  BoundEdge *pBVar27;
  Bounds3f *pBVar28;
  BoundEdge *__i;
  ulong uVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  float fVar32;
  undefined8 uVar33;
  undefined1 auVar34 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  float fVar38;
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar42;
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 in_XMM20 [16];
  Vector3<float> VVar45;
  long lVar46;
  uint local_178;
  float local_110;
  Bounds3f bounds1;
  Bounds3f bounds0;
  
  bounds0.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)nodeNum;
  bounds1.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)this->nextFreeNode;
  if (this->nextFreeNode != nodeNum) {
    LogFatal<char_const(&)[8],char_const(&)[13],char_const(&)[8],int&,char_const(&)[13],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/aggregates.cpp"
               ,0x363,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [8])"nodeNum",
               (char (*) [13])"nextFreeNode",(char (*) [8])"nodeNum",(int *)&bounds0,
               (char (*) [13])"nextFreeNode",(int *)&bounds1);
  }
  iVar20 = nodeNum;
  if (this->nAllocedNodes == nodeNum) {
    uVar29 = 0x200;
    if (0x200 < nodeNum * 2) {
      uVar29 = (ulong)(uint)(nodeNum * 2);
    }
    pKVar15 = (KdAccelNode *)operator_new__(uVar29 * 8);
    if (0 < nodeNum) {
      __src = this->nodes;
      memcpy(pKVar15,__src,(ulong)(uint)nodeNum << 3);
      if (__src != (KdAccelNode *)0x0) {
        operator_delete__(__src);
        iVar20 = this->nextFreeNode;
      }
    }
    this->nodes = pKVar15;
    this->nAllocedNodes = (int)uVar29;
  }
  this->nextFreeNode = iVar20 + 1;
  if ((depth == 0) || (nPrimitives <= this->maxPrims)) {
    KdAccelNode::InitLeaf(this->nodes + nodeNum,primNums,nPrimitives,&this->primitiveIndices);
    return;
  }
  fVar8 = (float)nPrimitives * (float)this->isectCost;
  fVar32 = Bounds3<float>::SurfaceArea(nodeBounds);
  this_00 = &nodeBounds->pMax;
  uVar33 = 0;
  VVar45 = Point3<float>::operator-(this_00,&nodeBounds->pMin);
  uVar13 = Bounds3<float>::MaxDimension(nodeBounds);
  uVar10 = nPrimitives * 2;
  pfVar1 = &(nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
  pfVar2 = &(nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.z;
  auVar31._8_8_ = uVar33;
  auVar31._0_8_ = VVar45.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  lVar16 = (long)(int)uVar10;
  pfVar3 = &(nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.y;
  pfVar4 = &(nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.z;
  auVar31 = vmovshdup_avx512vl(auVar31);
  iVar20 = 0;
  local_178 = 0xffffffff;
  while( true ) {
    local_110 = VVar45.super_Tuple3<pbrt::Vector3,_float>.z;
    pBVar7 = (allPrimBounds->
             super__Vector_base<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    for (uVar29 = 0; uVar29 != (uint)(~(nPrimitives >> 0x1f) & nPrimitives); uVar29 = uVar29 + 1) {
      iVar14 = primNums[uVar29];
      pBVar21 = pBVar7 + iVar14;
      if (uVar13 == 1) {
        pBVar26 = edges[uVar13]._M_t.
                  super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                  .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
        pBVar27 = pBVar26 + uVar29 * 2;
        pBVar26[uVar29 * 2].t = (pBVar21->pMin).super_Tuple3<pbrt::Point3,_float>.y;
        lVar46 = 0x10;
      }
      else if (uVar13 == 0) {
        pBVar26 = edges[uVar13]._M_t.
                  super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                  .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
        pBVar27 = pBVar26 + uVar29 * 2;
        pBVar26[uVar29 * 2].t = (pBVar21->pMin).super_Tuple3<pbrt::Point3,_float>.x;
        lVar46 = 0xc;
      }
      else {
        pBVar26 = edges[(int)uVar13]._M_t.
                  super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                  .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
        pBVar27 = pBVar26 + uVar29 * 2;
        pBVar26[uVar29 * 2].t = (pBVar21->pMin).super_Tuple3<pbrt::Point3,_float>.z;
        lVar46 = 0x14;
      }
      pBVar27->primNum = iVar14;
      pBVar27->type = Start;
      uVar24 = (int)uVar29 * 2 | 1;
      pBVar26[uVar24].t =
           *(Float *)((long)&(pBVar21->pMin).super_Tuple3<pbrt::Point3,_float>.x + lVar46);
      pBVar26[uVar24].primNum = iVar14;
      pBVar26[uVar24].type = End;
    }
    if (nPrimitives != 0) {
      pBVar27 = edges[(int)uVar13]._M_t.
                super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>._M_t
                .super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>.
                super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
      std::
      __introsort_loop<pbrt::BoundEdge*,long,__gnu_cxx::__ops::_Iter_comp_iter<pbrt::KdTreeAggregate::buildTree(int,pbrt::Bounds3<float>const&,std::vector<pbrt::Bounds3<float>,std::allocator<pbrt::Bounds3<float>>>const&,int*,int,int,std::unique_ptr<pbrt::BoundEdge[],std::default_delete<pbrt::BoundEdge[]>>const*,int*,int*,int)::__0>>
                (pBVar27,pBVar27 + lVar16,(int)LZCOUNT(lVar16) * 2 ^ 0x7e);
      if (nPrimitives < 9) {
        std::
        __insertion_sort<pbrt::BoundEdge*,__gnu_cxx::__ops::_Iter_comp_iter<pbrt::KdTreeAggregate::buildTree(int,pbrt::Bounds3<float>const&,std::vector<pbrt::Bounds3<float>,std::allocator<pbrt::Bounds3<float>>>const&,int*,int,int,std::unique_ptr<pbrt::BoundEdge[],std::default_delete<pbrt::BoundEdge[]>>const*,int*,int*,int)::__0>>
                  (pBVar27,pBVar27 + lVar16);
      }
      else {
        pBVar26 = pBVar27 + 0x10;
        std::
        __insertion_sort<pbrt::BoundEdge*,__gnu_cxx::__ops::_Iter_comp_iter<pbrt::KdTreeAggregate::buildTree(int,pbrt::Bounds3<float>const&,std::vector<pbrt::Bounds3<float>,std::allocator<pbrt::Bounds3<float>>>const&,int*,int,int,std::unique_ptr<pbrt::BoundEdge[],std::default_delete<pbrt::BoundEdge[]>>const*,int*,int*,int)::__0>>
                  (pBVar27,pBVar26);
        for (lVar46 = lVar16 * 0xc + -0xc0; lVar46 != 0; lVar46 = lVar46 + -0xc) {
          std::
          __unguarded_linear_insert<pbrt::BoundEdge*,__gnu_cxx::__ops::_Val_comp_iter<pbrt::KdTreeAggregate::buildTree(int,pbrt::Bounds3<float>const&,std::vector<pbrt::Bounds3<float>,std::allocator<pbrt::Bounds3<float>>>const&,int*,int,int,std::unique_ptr<pbrt::BoundEdge[],std::default_delete<pbrt::BoundEdge[]>>const*,int*,int*,int)::__0>>
                    (pBVar26);
          pBVar26 = pBVar26 + 1;
        }
      }
    }
    uVar18 = (int)(uVar13 + 1) % 3;
    iVar19 = (int)(uVar13 + 2) % 3;
    fVar9 = 1.0 - this->emptyBonus;
    auVar34._0_4_ = (float)this->traversalCost;
    auVar34._4_12_ = in_ZMM3._4_12_;
    lVar46 = 8;
    iVar25 = 0;
    uVar24 = 0xffffffff;
    auVar11._8_8_ = uVar33;
    auVar11._0_8_ = VVar45.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    iVar14 = nPrimitives;
    for (uVar29 = 0; (~((int)uVar10 >> 0x1f) & uVar10) != uVar29; uVar29 = uVar29 + 1) {
      pBVar27 = edges[(int)uVar13]._M_t.
                super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>._M_t
                .super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>.
                super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
      iVar6 = *(int *)((long)&pBVar27->t + lVar46);
      pBVar28 = nodeBounds;
      if ((uVar13 != 0) && (pBVar28 = (Bounds3f *)pfVar1, uVar13 != 1)) {
        pBVar28 = (Bounds3f *)pfVar2;
      }
      fVar5 = *(float *)((long)pBVar27 + lVar46 + -8);
      in_ZMM3 = ZEXT464((uint)fVar5);
      iVar14 = iVar14 - (uint)(iVar6 == 1);
      if ((pBVar28->pMin).super_Tuple3<pbrt::Point3,_float>.x < fVar5) {
        pPVar17 = this_00;
        if ((uVar13 != 0) && (pPVar17 = (Point3<float> *)pfVar3, uVar13 != 1)) {
          pPVar17 = (Point3<float> *)pfVar4;
        }
        if (fVar5 < (pPVar17->super_Tuple3<pbrt::Point3,_float>).x) {
          auVar44 = ZEXT416((uint)local_110);
          auVar35 = auVar11;
          if ((uVar18 != 0) && (auVar35 = auVar31, uVar18 != 1)) {
            auVar35 = auVar44;
          }
          auVar36 = auVar11;
          if ((iVar19 != 0) && (auVar36 = auVar31, iVar19 != 1)) {
            auVar36 = auVar44;
          }
          pBVar28 = nodeBounds;
          if ((uVar13 != 0) && (pBVar28 = (Bounds3f *)pfVar1, uVar13 != 1)) {
            pBVar28 = (Bounds3f *)pfVar2;
          }
          fVar43 = VVar45.super_Tuple3<pbrt::Vector3,_float>.x;
          fVar37 = auVar31._0_4_;
          fVar38 = fVar43;
          if ((uVar18 != 0) && (fVar38 = fVar37, uVar18 != 1)) {
            fVar38 = local_110;
          }
          fVar39 = fVar43;
          if ((iVar19 != 0) && (fVar39 = fVar37, iVar19 != 1)) {
            fVar39 = local_110;
          }
          auVar40 = auVar11;
          if ((uVar18 != 0) && (auVar40 = auVar31, uVar18 != 1)) {
            auVar40 = auVar44;
          }
          auVar41 = auVar11;
          if ((iVar19 != 0) && (auVar41 = auVar31, iVar19 != 1)) {
            auVar41 = auVar44;
          }
          pPVar17 = this_00;
          if ((uVar13 != 0) && (pPVar17 = (Point3<float> *)pfVar3, uVar13 != 1)) {
            pPVar17 = (Point3<float> *)pfVar4;
          }
          fVar42 = fVar43;
          if ((uVar18 != 0) && (fVar42 = fVar37, uVar18 != 1)) {
            fVar42 = local_110;
          }
          if ((iVar19 != 0) && (fVar43 = fVar37, iVar19 != 1)) {
            fVar43 = local_110;
          }
          auVar44 = vcvtsi2ss_avx512f(in_XMM20,iVar14);
          bVar30 = iVar25 == 0;
          auVar40 = vfmadd213ss_fma(auVar41,auVar40,
                                    ZEXT416((uint)((fVar42 + fVar43) *
                                                  ((pPVar17->super_Tuple3<pbrt::Point3,_float>).x -
                                                  fVar5))));
          auVar36 = vfmadd213ss_fma(auVar36,auVar35,
                                    ZEXT416((uint)((fVar5 - (pBVar28->pMin).
                                                            super_Tuple3<pbrt::Point3,_float>.x) *
                                                  (fVar38 + fVar39))));
          auVar35 = vcvtsi2ss_avx512f(in_XMM20,iVar25);
          auVar35 = vfmadd231ss_fma(ZEXT416((uint)((1.0 / fVar32) * (auVar40._0_4_ + auVar40._0_4_)
                                                  * auVar44._0_4_)),
                                    ZEXT416((uint)((1.0 / fVar32) * (auVar36._0_4_ + auVar36._0_4_))
                                           ),auVar35);
          auVar44 = vfmadd213ss_fma(auVar35,ZEXT416((uint)((float)((uint)(iVar14 == 0) * (int)fVar9
                                                                  + (uint)(iVar14 != 0) *
                                                                    ((uint)bVar30 * (int)fVar9 +
                                                                    (uint)!bVar30 * 0x3f800000)) *
                                                          (float)this->isectCost)),auVar34);
          in_ZMM3 = ZEXT1664(auVar44);
          auVar35 = vucomiss_avx512f(auVar44);
          vminss_avx512f(auVar44,auVar35);
          if (!bVar30) {
            local_178 = (uint)uVar29;
            uVar24 = uVar13;
          }
        }
      }
      iVar25 = iVar25 + (uint)(iVar6 == 0);
      lVar46 = lVar46 + 0xc;
    }
    if ((iVar25 != nPrimitives) || (iVar14 != 0)) {
      LogFatal<char_const(&)[37]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/aggregates.cpp"
                 ,0x3b4,"Check failed: %s",(char (*) [37])"nBelow == nPrimitives && nAbove == 0");
    }
    bVar30 = 1 < iVar20;
    if (bVar30 || uVar24 != 0xffffffff) break;
    iVar20 = iVar20 + 1;
    uVar13 = uVar18;
LAB_0041ce4e:
    if (bVar30 || uVar24 != 0xffffffff) {
      return;
    }
  }
  vucomiss_avx512f(ZEXT416((uint)fVar8));
  vucomiss_avx512f(ZEXT416((uint)(fVar8 * 4.0)));
  if ((uVar24 == 0xffffffff) || (badRefines == 3)) {
    KdAccelNode::InitLeaf(this->nodes + nodeNum,primNums,nPrimitives,&this->primitiveIndices);
    return;
  }
  iVar14 = 0;
  for (lVar46 = 0; (ulong)(~((int)local_178 >> 0x1f) & local_178) * 0xc - lVar46 != 0;
      lVar46 = lVar46 + 0xc) {
    pBVar27 = edges[(int)uVar24]._M_t.
              super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>._M_t.
              super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>.
              super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
    if (*(int *)((long)&pBVar27->type + lVar46) == 0) {
      lVar22 = (long)iVar14;
      iVar14 = iVar14 + 1;
      prims0[lVar22] = *(int *)((long)&pBVar27->primNum + lVar46);
    }
  }
  pBVar27 = edges[(int)uVar24]._M_t.
            super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>._M_t.
            super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>.
            super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
  lVar46 = (long)(int)local_178;
  uVar29 = 0;
  do {
    pEVar12 = &pBVar27[lVar46 + 1].type;
    do {
      pEVar23 = pEVar12;
      lVar46 = lVar46 + 1;
      if (lVar16 <= lVar46) {
        fVar9 = pBVar27[(int)local_178].t;
        bounds0.pMax.super_Tuple3<pbrt::Point3,_float>.y =
             (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.y;
        bounds0.pMax.super_Tuple3<pbrt::Point3,_float>.z =
             (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.z;
        bounds0.pMin.super_Tuple3<pbrt::Point3,_float>.x =
             (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.x;
        bounds0.pMin.super_Tuple3<pbrt::Point3,_float>.y =
             (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
        bounds0._8_8_ = *(undefined8 *)&(nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.z;
        bounds1.pMax.super_Tuple3<pbrt::Point3,_float>.y =
             (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.y;
        bounds1.pMax.super_Tuple3<pbrt::Point3,_float>.z =
             (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.z;
        bounds1.pMin.super_Tuple3<pbrt::Point3,_float>.x =
             (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.x;
        bounds1.pMin.super_Tuple3<pbrt::Point3,_float>.y =
             (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
        bounds1._8_8_ = *(undefined8 *)&(nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.z;
        if (uVar24 == 1) {
          bounds1.pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar9;
          pPVar17 = (Point3<float> *)&bounds0.pMax.super_Tuple3<pbrt::Point3,_float>.y;
        }
        else if (uVar24 == 0) {
          bounds1.pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar9;
          pPVar17 = &bounds0.pMax;
        }
        else {
          pPVar17 = (Point3<float> *)&bounds0.pMax.super_Tuple3<pbrt::Point3,_float>.z;
          bounds1.pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar9;
        }
        (pPVar17->super_Tuple3<pbrt::Point3,_float>).x = fVar9;
        buildTree(this,nodeNum + 1,&bounds0,allPrimBounds,prims0,iVar14,depth + -1,edges,prims0,
                  prims1 + nPrimitives,badRefines);
        iVar14 = this->nextFreeNode;
        pKVar15 = this->nodes;
        pKVar15[nodeNum].field_0.onePrimitive = (int)fVar9;
        pKVar15[nodeNum].field_1.flags = iVar14 * 4 | uVar24;
        buildTree(this,iVar14,&bounds1,allPrimBounds,prims1,(int)uVar29,depth + -1,edges,prims0,
                  prims1 + nPrimitives,badRefines);
        goto LAB_0041ce4e;
      }
      pEVar12 = pEVar23 + 3;
    } while (*pEVar23 != End);
    prims1[uVar29] = pEVar23[-1];
    uVar29 = (ulong)((int)uVar29 + 1);
  } while( true );
}

Assistant:

void KdTreeAggregate::buildTree(int nodeNum, const Bounds3f &nodeBounds,
                                const std::vector<Bounds3f> &allPrimBounds, int *primNums,
                                int nPrimitives, int depth,
                                const std::unique_ptr<BoundEdge[]> edges[3], int *prims0,
                                int *prims1, int badRefines) {
    CHECK_EQ(nodeNum, nextFreeNode);
    // Get next free node from _nodes_ array
    if (nextFreeNode == nAllocedNodes) {
        int nNewAllocNodes = std::max(2 * nAllocedNodes, 512);
        KdAccelNode *n = new KdAccelNode[nNewAllocNodes];
        if (nAllocedNodes > 0) {
            memcpy(n, nodes, nAllocedNodes * sizeof(KdAccelNode));
            delete[] nodes;
        }
        nodes = n;
        nAllocedNodes = nNewAllocNodes;
    }
    ++nextFreeNode;

    // Initialize leaf node if termination criteria met
    if (nPrimitives <= maxPrims || depth == 0) {
        nodes[nodeNum].InitLeaf(primNums, nPrimitives, &primitiveIndices);
        return;
    }

    // Initialize interior node and continue recursion
    // Choose split axis position for interior node
    int bestAxis = -1, bestOffset = -1;
    Float bestCost = Infinity;
    Float oldCost = isectCost * Float(nPrimitives);
    Float totalSA = nodeBounds.SurfaceArea();
    Float invTotalSA = 1 / totalSA;
    Vector3f d = nodeBounds.pMax - nodeBounds.pMin;
    // Choose which axis to split along
    int axis = nodeBounds.MaxDimension();

    int retries = 0;
retrySplit:
    // Initialize edges for _axis_
    for (int i = 0; i < nPrimitives; ++i) {
        int pn = primNums[i];
        const Bounds3f &bounds = allPrimBounds[pn];
        edges[axis][2 * i] = BoundEdge(bounds.pMin[axis], pn, true);
        edges[axis][2 * i + 1] = BoundEdge(bounds.pMax[axis], pn, false);
    }
    // Sort _edges_ for _axis_
    std::sort(&edges[axis][0], &edges[axis][2 * nPrimitives],
              [](const BoundEdge &e0, const BoundEdge &e1) -> bool {
                  if (e0.t == e1.t)
                      return (int)e0.type < (int)e1.type;
                  else
                      return e0.t < e1.t;
              });

    // Compute cost of all splits for _axis_ to find best
    int nBelow = 0, nAbove = nPrimitives;
    for (int i = 0; i < 2 * nPrimitives; ++i) {
        if (edges[axis][i].type == EdgeType::End)
            --nAbove;
        Float edgeT = edges[axis][i].t;
        if (edgeT > nodeBounds.pMin[axis] && edgeT < nodeBounds.pMax[axis]) {
            // Compute cost for split at _i_th edge
            // Compute child surface areas for split at _edgeT_
            int otherAxis0 = (axis + 1) % 3, otherAxis1 = (axis + 2) % 3;
            Float belowSA =
                2 * (d[otherAxis0] * d[otherAxis1] +
                     (edgeT - nodeBounds.pMin[axis]) * (d[otherAxis0] + d[otherAxis1]));
            Float aboveSA =
                2 * (d[otherAxis0] * d[otherAxis1] +
                     (nodeBounds.pMax[axis] - edgeT) * (d[otherAxis0] + d[otherAxis1]));

            Float pBelow = belowSA * invTotalSA;
            Float pAbove = aboveSA * invTotalSA;
            Float eb = (nAbove == 0 || nBelow == 0) ? emptyBonus : 0;
            Float cost = traversalCost +
                         isectCost * (1 - eb) * (pBelow * nBelow + pAbove * nAbove);
            // Update best split if this is lowest cost so far
            if (cost < bestCost) {
                bestCost = cost;
                bestAxis = axis;
                bestOffset = i;
            }
        }
        if (edges[axis][i].type == EdgeType::Start)
            ++nBelow;
    }
    CHECK(nBelow == nPrimitives && nAbove == 0);

    // Create leaf if no good splits were found
    if (bestAxis == -1 && retries < 2) {
        ++retries;
        axis = (axis + 1) % 3;
        goto retrySplit;
    }
    if (bestCost > oldCost)
        ++badRefines;
    if ((bestCost > 4 * oldCost && nPrimitives < 16) || bestAxis == -1 ||
        badRefines == 3) {
        nodes[nodeNum].InitLeaf(primNums, nPrimitives, &primitiveIndices);
        return;
    }

    // Classify primitives with respect to split
    int n0 = 0, n1 = 0;
    for (int i = 0; i < bestOffset; ++i)
        if (edges[bestAxis][i].type == EdgeType::Start)
            prims0[n0++] = edges[bestAxis][i].primNum;
    for (int i = bestOffset + 1; i < 2 * nPrimitives; ++i)
        if (edges[bestAxis][i].type == EdgeType::End)
            prims1[n1++] = edges[bestAxis][i].primNum;

    // Recursively initialize children nodes
    Float tSplit = edges[bestAxis][bestOffset].t;
    Bounds3f bounds0 = nodeBounds, bounds1 = nodeBounds;
    bounds0.pMax[bestAxis] = bounds1.pMin[bestAxis] = tSplit;
    buildTree(nodeNum + 1, bounds0, allPrimBounds, prims0, n0, depth - 1, edges, prims0,
              prims1 + nPrimitives, badRefines);
    int aboveChild = nextFreeNode;
    nodes[nodeNum].InitInterior(bestAxis, aboveChild, tSplit);
    buildTree(aboveChild, bounds1, allPrimBounds, prims1, n1, depth - 1, edges, prims0,
              prims1 + nPrimitives, badRefines);
}